

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::encode_bc1_endpoint_search
               (color32 *pSrc_pixels,bool any_black_pixels,uint32_t flags,
               bc1_encode_results *results,uint32_t cur_err)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  anon_union_4_3_898e29d3_for_color32_0 hb_00;
  uint32_t hg_00;
  int *in_RCX;
  uint in_EDX;
  undefined1 in_SIL;
  undefined8 in_RDI;
  uint in_R8D;
  uint32_t trial_err;
  uint8_t trial_sels [16];
  int trial_hb;
  int trial_hg;
  int trial_hr;
  int trial_lb;
  int trial_lg;
  int trial_lr;
  int8_t delta [3];
  int i;
  int endpoint_search_rounds;
  int forbidden_direction;
  int prev_improvement_index;
  uint8_t *sels;
  int *hb;
  int *hg;
  int *hr;
  int *lb;
  int *lg;
  int *lr;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  uint in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff54;
  color32 *in_stack_ffffffffffffff58;
  undefined4 local_a0;
  uint32_t in_stack_ffffffffffffff64;
  int local_94;
  int local_8c;
  int local_84;
  undefined1 in_stack_ffffffffffffff84;
  char cVar4;
  char cVar5;
  char cVar6;
  uint cur_err_00;
  uint local_70;
  uint local_6c;
  uint32_t *puVar7;
  int *piVar8;
  anon_union_4_3_898e29d3_for_color32_0 *pSrc_pixels_00;
  int *piVar9;
  uint32_t in_stack_ffffffffffffffd0;
  uint local_2c;
  int *piVar10;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar11;
  
  uVar11 = CONCAT13(in_SIL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  piVar9 = in_RCX + 1;
  pSrc_pixels_00 = (anon_union_4_3_898e29d3_for_color32_0 *)(in_RCX + 2);
  piVar8 = in_RCX + 3;
  puVar7 = (uint32_t *)(in_RCX + 4);
  local_6c = 0;
  local_70 = 0xffffffff;
  uVar2 = in_EDX >> 0x16;
  cur_err_00 = 0;
  local_2c = in_R8D;
  piVar10 = in_RCX;
  do {
    if ((int)uVar2 <= (int)cur_err_00) {
      return;
    }
    if (local_70 != (cur_err_00 & 0x1f)) {
      cVar4 = s_adjacent_voxels[(long)(int)(cur_err_00 & 0xf) * 4];
      cVar5 = s_adjacent_voxels[(long)(int)(cur_err_00 & 0xf) * 4 + 1];
      cVar6 = s_adjacent_voxels[(long)(int)(cur_err_00 & 0xf) * 4 + 2];
      iVar3 = *in_RCX;
      local_84 = *piVar9;
      hb_00.field_0 =
           (anon_struct_4_4_d83cdc77_for_anon_union_4_3_898e29d3_for_color32_0_0)pSrc_pixels_00->m;
      local_8c = *piVar8;
      hg_00 = *puVar7;
      local_94 = in_RCX[5];
      if (((int)cur_err_00 >> 4 & 1U) == 0) {
        local_8c = clampi(local_8c + cVar4,0,0x1f);
        hg_00 = clampi(hg_00 + (int)cVar5,0,0x3f);
        local_94 = clampi(local_94 + cVar6,0,0x1f);
      }
      else {
        iVar3 = clampi(iVar3 + cVar4,0,0x1f);
        local_84 = clampi(local_84 + cVar5,0,0x3f);
        hb_00.m = clampi(hb_00.m + (int)cVar6,0,0x1f);
      }
      if ((*(byte *)(piVar10 + 10) & 1) == 0) {
        in_stack_ffffffffffffff54 =
             bc1_find_sels4(in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,
                            in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,hg_00,hb_00.m,
                            (uint8_t *)
                            CONCAT17(cVar6,CONCAT16(cVar5,CONCAT15(cVar4,CONCAT14(
                                                  in_stack_ffffffffffffff84,iVar3)))),cur_err_00);
      }
      else {
        uVar1 = in_stack_ffffffffffffff50 & 0xffffff;
        if ((uVar11 & 0x1000000) != 0) {
          uVar1 = CONCAT13((in_EDX & 8) != 0,(int3)in_stack_ffffffffffffff50);
        }
        in_stack_ffffffffffffff50 = uVar1;
        in_stack_ffffffffffffff54 =
             bc1_find_sels3_fullerr
                       (SUB81((ulong)piVar9 >> 0x18,0),(color32 *)&pSrc_pixels_00->field_0,
                        (uint32_t)((ulong)piVar8 >> 0x20),(uint32_t)piVar8,
                        (uint32_t)((ulong)puVar7 >> 0x20),(uint32_t)puVar7,in_stack_ffffffffffffffd0
                        ,(uint32_t)piVar10,(uint8_t *)CONCAT44(uVar11,in_EDX),(uint32_t)in_RDI);
      }
      if (in_stack_ffffffffffffff54 < local_2c) {
        local_70 = (int)(char)s_adjacent_voxels[(long)(int)(cur_err_00 & 0xf) * 4 + 3] |
                   cur_err_00 & 0x10;
        *in_RCX = iVar3;
        *piVar9 = local_84;
        pSrc_pixels_00->m = (uint32_t)hb_00;
        *piVar8 = local_8c;
        *puVar7 = hg_00;
        in_RCX[5] = local_94;
        *(color32 **)(in_RCX + 6) = in_stack_ffffffffffffff58;
        *(ulong *)(in_RCX + 8) = CONCAT44(in_stack_ffffffffffffff64,local_a0);
        local_6c = cur_err_00;
        local_2c = in_stack_ffffffffffffff54;
      }
      if (0x20 < (int)(cur_err_00 - local_6c)) {
        return;
      }
    }
    cur_err_00 = cur_err_00 + 1;
  } while( true );
}

Assistant:

static inline void encode_bc1_endpoint_search(const color32 *pSrc_pixels, bool any_black_pixels,
		uint32_t flags, bc1_encode_results &results, uint32_t cur_err)
	{
		int &lr = results.lr, &lg = results.lg, &lb = results.lb, &hr = results.hr, &hg = results.hg, &hb = results.hb;
		uint8_t *sels = results.sels;
						
		int prev_improvement_index = 0, forbidden_direction = -1;
		
		const int endpoint_search_rounds = (flags & cEncodeBC1EndpointSearchRoundsMask) >> cEncodeBC1EndpointSearchRoundsShift;
		for (int i = 0; i < endpoint_search_rounds; i++)
		{
			assert(s_adjacent_voxels[ s_adjacent_voxels[i & 15][3] ][3] == (i & 15)); 
			
			if (forbidden_direction == (i & 31))
				continue;

			const int8_t delta[3] = { s_adjacent_voxels[i & 15][0], s_adjacent_voxels[i & 15][1], s_adjacent_voxels[i & 15][2] };

			int trial_lr = lr, trial_lg = lg, trial_lb = lb, trial_hr = hr, trial_hg = hg, trial_hb = hb;

			if ((i >> 4) & 1) 
			{
				trial_lr = clampi(trial_lr + delta[0], 0, 31);
				trial_lg = clampi(trial_lg + delta[1], 0, 63);
				trial_lb = clampi(trial_lb + delta[2], 0, 31);
			}
			else 
			{
				trial_hr = clampi(trial_hr + delta[0], 0, 31);
				trial_hg = clampi(trial_hg + delta[1], 0, 63);
				trial_hb = clampi(trial_hb + delta[2], 0, 31);
			}
										
			uint8_t trial_sels[16];

			uint32_t trial_err;
			if (results.m_3color)
			{
				trial_err = bc1_find_sels3_fullerr(
					((any_black_pixels) && ((flags & cEncodeBC1Use3ColorBlocksForBlackPixels) != 0)),
					pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, cur_err);
			}
			else
			{
				trial_err = bc1_find_sels4(flags, pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, cur_err);
			}

			if (trial_err < cur_err)
			{
				cur_err = trial_err;

				forbidden_direction = s_adjacent_voxels[i & 15][3] | (i & 16);

				lr = trial_lr, lg = trial_lg, lb = trial_lb, hr = trial_hr, hg = trial_hg, hb = trial_hb;

				memcpy(sels, trial_sels, 16);
					
				prev_improvement_index = i;
			}

			if (i - prev_improvement_index > 32) 
				break;
		}
	}